

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# environment_XXX.cpp
# Opt level: O3

bool __thiscall EnvironmentXXX::InitializeEnv(EnvironmentXXX *this,char *sEnvFile)

{
  FILE *__stream;
  runtime_error *this_00;
  stringstream ss;
  long *local_1c8 [2];
  long local_1b8 [2];
  stringstream local_1a8 [16];
  ostream local_198 [376];
  
  __stream = fopen(sEnvFile,"r");
  if (__stream != (FILE *)0x0) {
    (*(this->super_DiscreteSpaceInformation)._vptr_DiscreteSpaceInformation[0x1c])(this,__stream);
    fclose(__stream);
    (*(this->super_DiscreteSpaceInformation)._vptr_DiscreteSpaceInformation[0x1d])(this);
    (*(this->super_DiscreteSpaceInformation)._vptr_DiscreteSpaceInformation[0x23])(this);
    (*(this->super_DiscreteSpaceInformation)._vptr_DiscreteSpaceInformation[0x25])(this);
    return true;
  }
  local_1c8[0] = local_1b8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1c8,"ERROR: unable to open ","");
  std::__cxx11::stringstream::stringstream(local_1a8,(string *)local_1c8,_S_out|_S_in);
  if (local_1c8[0] != local_1b8) {
    operator_delete(local_1c8[0],local_1b8[0] + 1);
  }
  std::operator<<(local_198,sEnvFile);
  this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
  std::__cxx11::stringbuf::str();
  std::runtime_error::runtime_error(this_00,(string *)local_1c8);
  *(undefined ***)this_00 = &PTR__runtime_error_00157508;
  __cxa_throw(this_00,&SBPL_Exception::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

bool EnvironmentXXX::InitializeEnv(const char* sEnvFile)
{
    FILE* fCfg = fopen(sEnvFile, "r");
    if (fCfg == NULL) {
        std::stringstream ss("ERROR: unable to open ");
        ss << sEnvFile;
        throw SBPL_Exception(ss.str());
    }
    ReadConfiguration(fCfg);
    fclose(fCfg);

    //Initialize other parameters of the environment
    InitializeEnvConfig();

    //initialize Environment
    InitializeEnvironment();

    //pre-compute heuristics
    ComputeHeuristicValues();

    return true;
}